

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall
google::protobuf::DescriptorBuilder::AddSymbol
          (DescriptorBuilder *this,string *full_name,void *parent,string *name,Message *proto,
          Symbol symbol)

{
  bool bVar1;
  LogMessage *pLVar2;
  FileDescriptor *pFVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Symbol SVar5;
  Symbol symbol_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  LogMessage local_f0;
  string *local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pFVar3 = this->file_;
  SVar5._4_4_ = 0;
  SVar5.type = symbol.type;
  SVar5.field_1.descriptor = symbol.field_1.descriptor;
  local_b8 = name;
  bVar1 = DescriptorPool::Tables::AddSymbol(this->tables_,full_name,SVar5);
  if (bVar1) {
    if (parent != (void *)0x0) {
      pFVar3 = (FileDescriptor *)parent;
    }
    symbol_00._4_4_ = 0;
    symbol_00.type = symbol.type;
    symbol_00.field_1.descriptor = symbol.field_1.descriptor;
    bVar1 = FileDescriptorTables::AddAliasUnderParent(this->file_tables_,pFVar3,local_b8,symbol_00);
    if (bVar1) {
      return true;
    }
    if (this->had_errors_ == false) {
      internal::LogMessage::LogMessage
                (&local_f0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.cc"
                 ,0xf07);
      pLVar2 = internal::LogMessage::operator<<(&local_f0,"\"");
      pLVar2 = internal::LogMessage::operator<<(pLVar2,full_name);
      pLVar2 = internal::LogMessage::operator<<
                         (pLVar2,
                          "\" not previously defined in symbols_by_name_, but was defined in symbols_by_parent_; this shouldn\'t be possible."
                         );
      internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar2);
      internal::LogMessage::~LogMessage(&local_f0);
    }
  }
  else {
    SVar5 = DescriptorPool::Tables::FindSymbol(this->tables_,full_name);
    local_f0.filename_ = (char *)SVar5.field_1;
    local_f0.level_ = SVar5.type;
    pFVar3 = Symbol::GetFile((Symbol *)&local_f0);
    if (pFVar3 == this->file_) {
      lVar4 = std::__cxx11::string::rfind((char)full_name,0x2e);
      if (lVar4 == -1) {
        std::operator+(&local_110,"\"",full_name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,&local_110,"\" is already defined.");
        AddError(this,full_name,proto,NAME,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        this_00 = &local_110;
      }
      else {
        std::__cxx11::string::substr((ulong)&local_50,(ulong)full_name);
        std::operator+(&local_90,"\"",&local_50);
        std::operator+(&local_b0,&local_90,"\" is already defined in \"");
        std::__cxx11::string::substr((ulong)&local_70,(ulong)full_name);
        std::operator+(&local_110,&local_b0,&local_70);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_f0,&local_110,"\".");
        AddError(this,full_name,proto,NAME,(string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_f0);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_90);
        this_00 = &local_50;
      }
    }
    else {
      std::operator+(&local_90,"\"",full_name);
      std::operator+(&local_b0,&local_90,"\" is already defined in file \"");
      std::operator+(&local_110,&local_b0,
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)pFVar3);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f0,
                     &local_110,"\".");
      AddError(this,full_name,proto,NAME,(string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_b0);
      this_00 = &local_90;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  return false;
}

Assistant:

bool DescriptorBuilder::AddSymbol(
    const string& full_name, const void* parent, const string& name,
    const Message& proto, Symbol symbol) {
  // If the caller passed NULL for the parent, the symbol is at file scope.
  // Use its file as the parent instead.
  if (parent == NULL) parent = file_;

  if (tables_->AddSymbol(full_name, symbol)) {
    if (!file_tables_->AddAliasUnderParent(parent, name, symbol)) {
      // This is only possible if there was already an error adding something of
      // the same name.
      if (!had_errors_) {
        GOOGLE_LOG(DFATAL) << "\"" << full_name << "\" not previously defined in "
                       "symbols_by_name_, but was defined in "
                       "symbols_by_parent_; this shouldn't be possible.";
      }
      return false;
    }
    return true;
  } else {
    const FileDescriptor* other_file = tables_->FindSymbol(full_name).GetFile();
    if (other_file == file_) {
      string::size_type dot_pos = full_name.find_last_of('.');
      if (dot_pos == string::npos) {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name + "\" is already defined.");
      } else {
        AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
                 "\"" + full_name.substr(dot_pos + 1) +
                 "\" is already defined in \"" +
                 full_name.substr(0, dot_pos) + "\".");
      }
    } else {
      // Symbol seems to have been defined in a different file.
      AddError(full_name, proto, DescriptorPool::ErrorCollector::NAME,
               "\"" + full_name + "\" is already defined in file \"" +
               other_file->name() + "\".");
    }
    return false;
  }
}